

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O2

void __thiscall Transaction_GetRwInt_Test::TestBody(Transaction_GetRwInt_Test *this)

{
  TypedExpectation<pstore::address_(unsigned_long,_unsigned_int)> *pTVar1;
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> *pTVar2
  ;
  mock_database *this_00;
  MatcherBase<pstore::address> local_168;
  mock_mutex mutex;
  Expectation allocate_int;
  _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
  local_120;
  MatcherBase<unsigned_long> local_f0;
  MatcherBase<bool> local_d8;
  MatcherBase<bool> local_c0;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  pair<std::shared_ptr<int>,_pstore::typed_address<int>_> local_40;
  InvokeMethodAction<(anonymous_namespace)::mock_database,_std::shared_ptr<const_void>_((anonymous_namespace)::mock_database::*)(const_pstore::address_&,_unsigned_long,_bool,_bool)_const>
  local_28;
  
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&mutex,4);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&local_168,4);
  this_00 = &(this->super_Transaction).db_;
  anon_unknown.dwarf_32ce0a::mock_database::gmock_allocate
            ((MockSpec<pstore::address_(unsigned_long,_unsigned_int)> *)&transaction,this_00,
             (Matcher<unsigned_long> *)&mutex,(Matcher<unsigned_int> *)&local_168);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<pstore::address_(unsigned_long,_unsigned_int)>::
           InternalExpectedAt((MockSpec<pstore::address_(unsigned_long,_unsigned_int)> *)
                              &transaction,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                              ,0x1b0,"db_","allocate (sizeof (int), alignof (int))");
  local_f0.vtable_ = (VTable *)anon_unknown.dwarf_32ce0a::mock_database::base_allocate;
  local_f0.buffer_.ptr = (void *)0x0;
  local_f0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)this_00;
  testing::Action<pstore::address_(unsigned_long,_unsigned_int)>::
  Action<testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>,_void>
            ((Action<pstore::address_(unsigned_long,_unsigned_int)> *)&local_120,
             (InvokeMethodAction<(anonymous_namespace)::mock_database,_pstore::address_((anonymous_namespace)::mock_database::*)(unsigned_long,_unsigned_int)>
              *)&local_f0);
  pTVar1 = testing::internal::TypedExpectation<pstore::address_(unsigned_long,_unsigned_int)>::
           WillOnce(pTVar1,(Action<pstore::address_(unsigned_long,_unsigned_int)> *)&local_120);
  testing::Expectation::Expectation(&allocate_int,&pTVar1->super_ExpectationBase);
  std::_Function_base::~_Function_base((_Function_base *)&local_120);
  std::_Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_int>_>::
  ~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<unsigned_long>,_testing::Matcher<unsigned_int>_> *
               )&transaction.super_transaction_base.db_);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase
            ((MatcherBase<unsigned_int> *)&local_168);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase((MatcherBase<unsigned_long> *)&mutex);
  local_168.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::address>::
       GetVTable<testing::internal::MatcherBase<pstore::address>::ValuePolicy<testing::internal::GeMatcher<pstore::address>,true>>()
       ::kVTable;
  local_168.buffer_.d = 8.69555536680594e-322;
  local_168.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00255668;
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_f0,4);
  testing::Matcher<bool>::Matcher((Matcher<bool> *)&local_c0,false);
  testing::Matcher<bool>::Matcher((Matcher<bool> *)&local_d8,true);
  anon_unknown.dwarf_32ce0a::mock_database::gmock_get
            ((MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)> *)
             &transaction,this_00,(Matcher<pstore::address> *)&local_168,
             (Matcher<unsigned_long> *)&local_f0,(Matcher<bool> *)&local_c0,
             (Matcher<bool> *)&local_d8);
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::
           MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
           InternalExpectedAt((MockSpec<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>
                               *)&transaction,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                              ,0x1b6,"db_",
                              "get (Ge (pstore::address{pstore::leader_size + sizeof (pstore::trailer)}), sizeof (int), false, true)"
                             );
  testing::ExpectationSet::ExpectationSet((ExpectationSet *)&local_120,&allocate_int);
  pTVar2 = testing::internal::
           TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>
           ::After(pTVar2,(ExpectationSet *)&local_120);
  local_28.method_ptr =
       (offset_in_mock_database_to_subr)anon_unknown.dwarf_32ce0a::mock_database::base_get;
  local_28._16_8_ = 0;
  local_28.obj_ptr = this_00;
  testing::Action<std::shared_ptr<void_const>(pstore::address,unsigned_long,bool,bool)>::
  Action<testing::internal::InvokeMethodAction<(anonymous_namespace)::mock_database,std::shared_ptr<void_const>((anonymous_namespace)::mock_database::*)(pstore::address_const&,unsigned_long,bool,bool)const>,void>
            ((Action<std::shared_ptr<void_const>(pstore::address,unsigned_long,bool,bool)> *)&mutex,
             &local_28);
  testing::internal::
  TypedExpectation<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>::
  WillOnce(pTVar2,(Action<std::shared_ptr<const_void>_(pstore::address,_unsigned_long,_bool,_bool)>
                   *)&mutex);
  std::_Function_base::~_Function_base((_Function_base *)&mutex);
  std::
  _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
  ::~_Rb_tree(&local_120);
  std::
  _Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<pstore::address>,_testing::Matcher<unsigned_long>,_testing::Matcher<bool>,_testing::Matcher<bool>_>
                  *)&transaction.super_transaction_base.db_);
  testing::internal::MatcherBase<bool>::~MatcherBase(&local_d8);
  testing::internal::MatcherBase<bool>::~MatcherBase(&local_c0);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_f0);
  testing::internal::MatcherBase<pstore::address>::~MatcherBase(&local_168);
  testing::Expectation::~Expectation(&allocate_int);
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&local_120,&mutex);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&transaction,&this_00->super_database,(unique_lock<mock_mutex> *)&local_120);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&local_120);
  pstore::transaction_base::alloc_rw<int,void>(&local_40,&transaction.super_transaction_base,1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.first.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pstore::transaction_base::commit(&transaction.super_transaction_base);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&transaction);
  return;
}

Assistant:

TEST_F (Transaction, GetRwInt) {
    // First setup the mock expectations.
    {
        using ::testing::Expectation;
        using ::testing::Ge;
        using ::testing::Invoke;

        Expectation allocate_int = EXPECT_CALL (db_, allocate (sizeof (int), alignof (int)))
                                       .WillOnce (Invoke (&db_, &mock_database::base_allocate));

        // A call to get(). First argument (address) must lie beyond the initial transaction
        // and must request a writable int.
        EXPECT_CALL (db_, get (Ge (pstore::address{pstore::leader_size + sizeof (pstore::trailer)}),
                               sizeof (int), false, true))
            .After (allocate_int)
            .WillOnce (Invoke (&db_, &mock_database::base_get));
    }
    // Now the real body of the test
    {
        mock_mutex mutex;
        auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
        transaction.alloc_rw<int> ();
        transaction.commit ();
    }
}